

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void delete_ir(Context_conflict *ctx,void *_ir)

{
  MOJOSHADER_irNode *ir;
  void *_ir_local;
  Context_conflict *ctx_local;
  
  if (_ir != (void *)0x0) {
    switch(*_ir) {
    case 1:
    case 2:
    case 4:
    case 0xf:
    case 0x12:
    case 0x13:
      break;
    case 3:
      delete_ir(ctx,*(void **)((long)_ir + 0x28));
      delete_ir(ctx,*(void **)((long)_ir + 0x30));
      break;
    case 5:
      delete_ir(ctx,*(void **)((long)_ir + 0x28));
      break;
    case 6:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      delete_ir(ctx,*(void **)((long)_ir + 0x28));
      break;
    case 7:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      delete_ir(ctx,*(void **)((long)_ir + 0x28));
      break;
    case 8:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      break;
    case 9:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      break;
    case 10:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      break;
    default:
      __assert_fail("0 && \"unexpected IR node\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1717,"void delete_ir(Context *, void *)");
    case 0xd:
      delete_ir(ctx,*(void **)((long)_ir + 0x18));
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      break;
    case 0xe:
      delete_ir(ctx,*(void **)((long)_ir + 0x18));
      break;
    case 0x10:
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      delete_ir(ctx,*(void **)((long)_ir + 0x28));
      break;
    case 0x11:
      delete_ir(ctx,*(void **)((long)_ir + 0x18));
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
      break;
    case 0x16:
      delete_ir(ctx,*(void **)((long)_ir + 0x18));
      delete_ir(ctx,*(void **)((long)_ir + 0x20));
    }
    Free(ctx,_ir);
  }
  return;
}

Assistant:

static void delete_ir(Context *ctx, void *_ir)
{
    MOJOSHADER_irNode *ir = (MOJOSHADER_irNode *) _ir;
    if (ir == NULL)
        return;

    switch (ir->ir.type)
    {
        case MOJOSHADER_IR_JUMP:
        case MOJOSHADER_IR_LABEL:
        case MOJOSHADER_IR_CONSTANT:
        case MOJOSHADER_IR_TEMP:
        case MOJOSHADER_IR_DISCARD:
        case MOJOSHADER_IR_MEMORY:
            break;  // nothing extra to free here.

        case MOJOSHADER_IR_BINOP:
            delete_ir(ctx, ir->expr.binop.left);
            delete_ir(ctx, ir->expr.binop.right);
            break;

        case MOJOSHADER_IR_CALL:
            delete_ir(ctx, ir->expr.call.args);
            break;

        case MOJOSHADER_IR_ESEQ:
            delete_ir(ctx, ir->expr.eseq.stmt);
            delete_ir(ctx, ir->expr.eseq.expr);
            break;

        case MOJOSHADER_IR_ARRAY:
            delete_ir(ctx, ir->expr.array.array);
            delete_ir(ctx, ir->expr.array.element);
            break;

        case MOJOSHADER_IR_MOVE:
            delete_ir(ctx, ir->stmt.move.dst);
            delete_ir(ctx, ir->stmt.move.src);
            break;

        case MOJOSHADER_IR_EXPR_STMT:
            delete_ir(ctx, ir->stmt.expr.expr);
            break;

        case MOJOSHADER_IR_CJUMP:
            delete_ir(ctx, ir->stmt.cjump.left);
            delete_ir(ctx, ir->stmt.cjump.right);
            break;

        case MOJOSHADER_IR_SEQ:
            delete_ir(ctx, ir->stmt.seq.first);
            delete_ir(ctx, ir->stmt.seq.next);  // !!! FIXME: don't recurse?
            break;

        case MOJOSHADER_IR_EXPRLIST:
            delete_ir(ctx, ir->misc.exprlist.expr);
            delete_ir(ctx, ir->misc.exprlist.next);  // !!! FIXME: don't recurse?
            break;

        case MOJOSHADER_IR_SWIZZLE:
            delete_ir(ctx, ir->expr.swizzle.expr);
            break;

        case MOJOSHADER_IR_CONSTRUCT:
            delete_ir(ctx, ir->expr.construct.args);
            break;

        case MOJOSHADER_IR_CONVERT:
            delete_ir(ctx, ir->expr.convert.expr);
            break;

        default: assert(0 && "unexpected IR node"); break;
    } // switch

    Free(ctx, ir);
}